

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<char[12],std::__cxx11::string,unsigned_char,int>
               (ostream *out,char *fmt,char (*args) [12],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               uchar *args_2,int *args_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff38;
  char local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<char[12],std::__cxx11::string,unsigned_char,int>
            ((char (*) [12])local_78,in_RSI,in_RDI,(int *)in_stack_ffffffffffffff38);
  vformat((ostream *)in_RSI,(char *)in_RDI,in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}